

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memory_stream.hpp
# Opt level: O2

position_type __thiscall
io::detail::memory_stream_impl<io::basic_string_view_stream<char,_std::char_traits<char>_>,_long>::
seek(memory_stream_impl<io::basic_string_view_stream<char,_std::char_traits<char>_>,_long> *this,
    offset_type from,seek_mode mode)

{
  position_type pVar1;
  system_error *this_00;
  error_code __ec;
  error_code ec;
  
  ec._M_value = 0;
  ec._M_cat = (error_category *)std::_V2::system_category();
  pVar1 = seek(this,from,mode,&ec);
  if (ec._M_value == 0) {
    return (position_type)pVar1.pos_;
  }
  this_00 = (system_error *)__cxa_allocate_exception(0x20);
  __ec._4_4_ = 0;
  __ec._M_value = ec._M_value;
  __ec._M_cat = ec._M_cat;
  std::system_error::system_error(this_00,__ec);
  __cxa_throw(this_00,&std::system_error::typeinfo,std::system_error::~system_error);
}

Assistant:

position_type seek(offset_type from, seek_mode mode)
    {
        std::error_code ec;
        auto pos = this->seek(from, mode, ec);
        if (ec) {
            throw std::system_error{ec};
        }
        return pos;
    }